

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::ruby::PackageToModule_abi_cxx11_
          (string *__return_storage_ptr__,ruby *this,string_view name)

{
  ruby *prVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (this != (ruby *)0x0) {
    prVar1 = (ruby *)0x0;
    do {
      if (prVar1[name._M_len] != (ruby)0x5f) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      prVar1 = prVar1 + 1;
    } while (this != prVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PackageToModule(absl::string_view name) {
  bool next_upper = true;
  std::string result;
  result.reserve(name.size());

  for (size_t i = 0; i < name.size(); i++) {
    if (name[i] == '_') {
      next_upper = true;
    } else {
      if (next_upper) {
        result.push_back(UpperChar(name[i]));
      } else {
        result.push_back(name[i]);
      }
      next_upper = false;
    }
  }

  return result;
}